

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChArchiveOut::ChArchiveOut(ChArchiveOut *this)

{
  mapped_type *pmVar1;
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *this_00;
  key_type local_18;
  ChArchiveOut *local_10;
  ChArchiveOut *this_local;
  
  local_10 = this;
  ChArchive::ChArchive(&this->super_ChArchive);
  (this->super_ChArchive)._vptr_ChArchive = (_func_int **)&PTR__ChArchiveOut_0014f478;
  this_00 = &this->internal_ptr_id;
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::unordered_map(this_00);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::unordered_map(&this->external_ptr_id);
  std::unordered_set<void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<void_*>_>::
  unordered_set(&this->cut_pointers);
  this->cut_all_pointers = false;
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::clear(this_00);
  local_18 = (key_type)0x0;
  pmVar1 = std::
           unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](this_00,&local_18);
  *pmVar1 = 0;
  this->currentID = 0;
  return;
}

Assistant:

ChArchiveOut() {

            cut_all_pointers = false;

            internal_ptr_id.clear();
            internal_ptr_id[0]=(0);  // ID=0 -> null pointer.
            currentID = 0;
        }